

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md.c
# Opt level: O2

char * mbedtls_md_get_name(mbedtls_md_info_t *md_info)

{
  md_name_entry *pmVar1;
  md_name_entry *pmVar2;
  
  if (md_info != (mbedtls_md_info_t *)0x0) {
    for (pmVar2 = md_names;
        (pmVar1 = md_names + 2, pmVar2->md_type != MBEDTLS_MD_NONE &&
        (pmVar1 = pmVar2, pmVar2->md_type != md_info->type)); pmVar2 = pmVar2 + 1) {
    }
    return pmVar1->md_name;
  }
  return (char *)0x0;
}

Assistant:

const char *mbedtls_md_get_name(const mbedtls_md_info_t *md_info)
{
    if (md_info == NULL) {
        return NULL;
    }

    const md_name_entry *entry = md_names;
    while (entry->md_type != MBEDTLS_MD_NONE &&
           entry->md_type != md_info->type) {
        ++entry;
    }

    return entry->md_name;
}